

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.h
# Opt level: O0

uint32_t __thiscall asmjit::_abi_1_10::InstNode::getRewriteIndex(InstNode *this,uint32_t *id)

{
  uint32_t *puVar1;
  ulong uVar2;
  uint32_t *in_RSI;
  InstNode *in_RDI;
  size_t index;
  uint32_t *array;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  
  puVar1 = _getRewriteArray(in_RDI);
  if (in_RSI < puVar1) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  uVar2 = (long)in_RSI - (long)puVar1 >> 2;
  if (0x1f < uVar2) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  return (uint32_t)uVar2;
}

Assistant:

inline uint32_t getRewriteIndex(const uint32_t* id) const noexcept {
    const uint32_t* array = _getRewriteArray();
    ASMJIT_ASSERT(array <= id);

    size_t index = (size_t)(id - array);
    ASMJIT_ASSERT(index < 32);

    return uint32_t(index);
  }